

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_misc.cpp
# Opt level: O1

void M_FindResponseFile(void)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  FILE *__stream;
  long lVar4;
  char **argv;
  DArgs *this;
  BYTE *pBVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  int argc;
  int local_60;
  uint local_5c;
  char *local_58;
  FString local_50;
  ulong local_48;
  FString local_40;
  FString local_38;
  
  iVar1 = DArgs::NumArgs(Args);
  uVar7 = 0;
  if (1 < iVar1) {
    uVar8 = 1;
    uVar7 = 0;
    do {
      iVar1 = (int)uVar8;
      pcVar3 = DArgs::GetArg(Args,iVar1);
      if (*pcVar3 == '@') {
        local_60 = 0;
        pcVar3 = DArgs::GetArg(Args,iVar1);
        local_5c = uVar7;
        if ((int)uVar7 < 100) {
          __stream = fopen(pcVar3 + 1,"rb");
          pcVar3 = DArgs::GetArg(Args,iVar1);
          if (__stream == (FILE *)0x0) {
            Printf("No such response file (%s)!\n",pcVar3 + 1);
            pcVar3 = (char *)0x0;
            lVar4 = 0;
            uVar7 = local_5c;
          }
          else {
            Printf("Found response file %s!\n");
            fseek(__stream,0,2);
            lVar4 = ftell(__stream);
            fseek(__stream,0,0);
            iVar6 = (int)lVar4;
            pcVar3 = (char *)operator_new__((long)(iVar6 + 1));
            fread(pcVar3,(long)iVar6,1,__stream);
            pcVar3[iVar6] = '\0';
            fclose(__stream);
            lVar4 = ParseCommandLine(pcVar3,&local_60,(char **)0x0);
            uVar7 = local_5c;
          }
        }
        else {
          Printf("Ignored response file %s.\n",pcVar3 + 1);
          pcVar3 = (char *)0x0;
          lVar4 = 0;
        }
        if ((long)local_60 == 0) {
          DArgs::RemoveArg(Args,iVar1);
        }
        else {
          argv = (char **)M_Malloc_Dbg(lVar4 + (long)local_60 * 8,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/m_misc.cpp"
                                       ,0xe3);
          *argv = (char *)(argv + local_60);
          local_58 = pcVar3;
          ParseCommandLine(pcVar3,(int *)0x0,argv);
          this = (DArgs *)M_Malloc_Dbg(0x38,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                       ,0x1f9);
          DArgs::DArgs(this);
          if (0 < iVar1) {
            iVar6 = 0;
            do {
              pcVar3 = DArgs::GetArg(Args,iVar6);
              FString::FString(&local_50,pcVar3);
              DArgs::AppendArg(this,&local_50);
              FString::~FString(&local_50);
              iVar6 = iVar6 + 1;
            } while (iVar1 != iVar6);
          }
          local_48 = uVar8;
          if (0 < local_60) {
            lVar4 = 0;
            do {
              FString::FString(&local_38,argv[lVar4]);
              DArgs::AppendArg(this,&local_38);
              FString::~FString(&local_38);
              lVar4 = lVar4 + 1;
            } while (lVar4 < local_60);
          }
          uVar8 = local_48;
          iVar6 = (int)local_48 + 1;
          iVar1 = DArgs::NumArgs(Args);
          uVar7 = local_5c;
          if (iVar6 < iVar1) {
            do {
              pcVar3 = DArgs::GetArg(Args,iVar6);
              FString::FString(&local_40,pcVar3);
              DArgs::AppendArg(this,&local_40);
              FString::~FString(&local_40);
              iVar6 = iVar6 + 1;
              iVar1 = DArgs::NumArgs(Args);
            } while (iVar6 < iVar1);
          }
          uVar7 = uVar7 + 1;
          pcVar3 = local_58;
          Args = this;
          if (uVar7 == 100) {
            Printf("Response file limit of %d hit.\n",100);
            pcVar3 = local_58;
          }
        }
        if (pcVar3 != (char *)0x0) {
          operator_delete__(pcVar3);
        }
      }
      else {
        uVar8 = (ulong)(iVar1 + 1);
      }
      iVar1 = DArgs::NumArgs(Args);
    } while ((int)uVar8 < iVar1);
  }
  if (0 < (int)uVar7) {
    pBVar5 = "s";
    if (uVar7 == 1) {
      pBVar5 = "";
    }
    uVar2 = DArgs::NumArgs(Args);
    Printf("Added %d response file%s, now have %d command-line args:\n",(ulong)uVar7,pBVar5,
           (ulong)uVar2);
    iVar1 = DArgs::NumArgs(Args);
    if (1 < iVar1) {
      iVar1 = 1;
      do {
        pcVar3 = DArgs::GetArg(Args,iVar1);
        Printf("%s\n",pcVar3);
        iVar1 = iVar1 + 1;
        iVar6 = DArgs::NumArgs(Args);
      } while (iVar1 < iVar6);
    }
  }
  return;
}

Assistant:

void M_FindResponseFile (void)
{
	const int limit = 100;	// avoid infinite recursion
	int added_stuff = 0;
	int i = 1;

	while (i < Args->NumArgs())
	{
		if (Args->GetArg(i)[0] != '@')
		{
			i++;
		}
		else
		{
			char	**argv;
			char	*file = NULL;
			int		argc = 0;
			FILE	*handle;
			int 	size;
			long	argsize = 0;
			int 	index;

			// Any more response files after the limit will be removed from the
			// command line.
			if (added_stuff < limit)
			{
				// READ THE RESPONSE FILE INTO MEMORY
				handle = fopen (Args->GetArg(i) + 1,"rb");
				if (!handle)
				{ // [RH] Make this a warning, not an error.
					Printf ("No such response file (%s)!\n", Args->GetArg(i) + 1);
				}
				else
				{
					Printf ("Found response file %s!\n", Args->GetArg(i) + 1);
					fseek (handle, 0, SEEK_END);
					size = ftell (handle);
					fseek (handle, 0, SEEK_SET);
					file = new char[size+1];
					fread (file, size, 1, handle);
					file[size] = 0;
					fclose (handle);

					argsize = ParseCommandLine (file, &argc, NULL);
				}
			}
			else
			{
				Printf ("Ignored response file %s.\n", Args->GetArg(i) + 1);
			}

			if (argc != 0)
			{
				argv = (char **)M_Malloc (argc*sizeof(char *) + argsize);
				argv[0] = (char *)argv + argc*sizeof(char *);
				ParseCommandLine (file, NULL, argv);

				// Create a new argument vector
				DArgs *newargs = new DArgs;

				// Copy parameters before response file.
				for (index = 0; index < i; ++index)
					newargs->AppendArg(Args->GetArg(index));

				// Copy parameters from response file.
				for (index = 0; index < argc; ++index)
					newargs->AppendArg(argv[index]);

				// Copy parameters after response file.
				for (index = i + 1; index < Args->NumArgs(); ++index)
					newargs->AppendArg(Args->GetArg(index));

				// Use the new argument vector as the global Args object.
				Args = newargs;
				if (++added_stuff == limit)
				{
					Printf("Response file limit of %d hit.\n", limit);
				}
			}
			else
			{
				// Remove the response file from the Args object
				Args->RemoveArg(i);
			}
			if (file != NULL)
			{
				delete[] file;
			}
		}
	}
	if (added_stuff > 0)
	{
		// DISPLAY ARGS
		Printf ("Added %d response file%s, now have %d command-line args:\n",
			added_stuff, added_stuff > 1 ? "s" : "", Args->NumArgs ());
		for (int k = 1; k < Args->NumArgs (); k++)
			Printf ("%s\n", Args->GetArg (k));
	}
}